

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O0

TestLog * deqp::gles3::Functional::DepthStencilCaseUtil::operator<<
                    (TestLog *log,StencilParams *params)

{
  MessageBuilder *pMVar1;
  Enum<int,_2UL> EVar2;
  Hex<8UL> local_238;
  GetNameFunc local_230;
  int local_228;
  Enum<int,_2UL> local_220;
  GetNameFunc local_210;
  int local_208;
  Enum<int,_2UL> local_200;
  GetNameFunc local_1f0;
  int local_1e8;
  Enum<int,_2UL> local_1e0;
  Hex<8UL> local_1d0;
  GetNameFunc local_1c8;
  int local_1c0;
  Enum<int,_2UL> local_1b8 [2];
  MessageBuilder local_198;
  StencilParams *local_18;
  StencilParams *params_local;
  TestLog *log_local;
  
  local_18 = params;
  params_local = (StencilParams *)log;
  tcu::TestLog::operator<<(&local_198,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [10])"  func = ");
  EVar2 = glu::getCompareFuncStr(local_18->function);
  local_1c8 = EVar2.m_getName;
  local_1c0 = EVar2.m_value;
  local_1b8[0].m_getName = local_1c8;
  local_1b8[0].m_value = local_1c0;
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1b8);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b8f97b);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [9])"  ref = ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_18->reference);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b8f97b);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [18])"  compare mask = ");
  local_1d0 = tcu::toHex<unsigned_int>(local_18->compareMask);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_1d0);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b8f97b);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [18])"  stencil fail = ");
  EVar2 = glu::getStencilOpStr(local_18->stencilFailOp);
  local_1f0 = EVar2.m_getName;
  local_1e8 = EVar2.m_value;
  local_1e0.m_getName = local_1f0;
  local_1e0.m_value = local_1e8;
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_1e0);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b8f97b);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [16])"  depth fail = ");
  EVar2 = glu::getStencilOpStr(local_18->depthFailOp);
  local_210 = EVar2.m_getName;
  local_208 = EVar2.m_value;
  local_200.m_getName = local_210;
  local_200.m_value = local_208;
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_200);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b8f97b);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [16])"  depth pass = ");
  EVar2 = glu::getStencilOpStr(local_18->depthPassOp);
  local_230 = EVar2.m_getName;
  local_228 = EVar2.m_value;
  local_220.m_getName = local_230;
  local_220.m_value = local_228;
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_220);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b8f97b);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [16])0x2b84cef);
  local_238 = tcu::toHex<unsigned_int>(local_18->writeMask);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_238);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b8f97b);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  return (TestLog *)params_local;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const StencilParams& params)
{
	log << TestLog::Message << "  func = " << glu::getCompareFuncStr(params.function) << "\n"
							<< "  ref = " << params.reference << "\n"
							<< "  compare mask = " << tcu::toHex(params.compareMask) << "\n"
							<< "  stencil fail = " << glu::getStencilOpStr(params.stencilFailOp) << "\n"
							<< "  depth fail = " << glu::getStencilOpStr(params.depthFailOp) << "\n"
							<< "  depth pass = " << glu::getStencilOpStr(params.depthPassOp) << "\n"
							<< "  write mask = " << tcu::toHex(params.writeMask) << "\n"
		<< TestLog::EndMessage;
	return log;
}